

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O2

void __thiscall SingleFileMuxer::~SingleFileMuxer(SingleFileMuxer *this)

{
  StreamInfo *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (StreamInfo *)p_Var1[1]._M_parent;
    if (this_00 != (StreamInfo *)0x0) {
      StreamInfo::~StreamInfo(this_00);
    }
    operator_delete(this_00,0x88);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_SingleFileMuxer::StreamInfo_*>,_std::_Select1st<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  ::~_Rb_tree(&(this->m_streamInfo)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->m_trackNameTmp)._M_t);
  AbstractMuxer::~AbstractMuxer(&this->super_AbstractMuxer);
  return;
}

Assistant:

SingleFileMuxer::~SingleFileMuxer()
{
    for (const auto& itr : m_streamInfo) delete itr.second;
}